

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::HttpEntityBodyReader
          (HttpEntityBodyReader *this,HttpInputStreamImpl *inner)

{
  Type in_ECX;
  int in_EDX;
  char *in_R8;
  char *in_R9;
  Fault f;
  DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
  _kjCondition;
  DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
  *in_stack_ffffffffffffffb8;
  Fault in_stack_ffffffffffffffc0;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined8 local_20;
  undefined1 local_18;
  
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_006d6be0;
  (this->weakInner).ptr = (HttpInputStreamImpl *)0x0;
  this->finished = false;
  local_38 = &inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>;
  local_18 = (inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
             currentWrapper.ptr == (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  local_30 = &kj::none;
  local_28 = " == ";
  local_20 = 5;
  if ((bool)local_18) {
    (inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr = &this->weakInner;
    (this->weakInner).ptr = inner;
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&,kj::None_const&>&,char_const(&)[65]>
            ((Fault *)&stack0xffffffffffffffc0,(char *)&local_38,in_EDX,in_ECX,in_R8,in_R9,
             in_stack_ffffffffffffffb8,(char (*) [65])in_stack_ffffffffffffffc0.exception);
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffc0);
}

Assistant:

HttpEntityBodyReader(HttpInputStreamImpl& inner) {
    inner.setCurrentWrapper(weakInner);
  }